

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O1

void chacha_set_counter(chacha_state *S,uint64_t counter)

{
  *(uint64_t *)(S->opaque + 0x20) = counter;
  return;
}

Assistant:

void
chacha_set_counter(chacha_state *S, uint64_t counter) {
    chacha_state_internal *state = (chacha_state_internal *)S;
    state->s[32] = (counter      ) & 0xff;
    state->s[33] = (counter >>  8) & 0xff;
    state->s[34] = (counter >> 16) & 0xff;
    state->s[35] = (counter >> 24) & 0xff;
    state->s[36] = (counter >> 32) & 0xff;
    state->s[37] = (counter >> 40) & 0xff;
    state->s[38] = (counter >> 48) & 0xff;
    state->s[39] = (counter >> 56);
}